

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  char cVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i a;
  __m256i alVar12;
  __m256i c;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i *palVar19;
  int iVar20;
  int iVar21;
  __m256i *ptr;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m256i *pv_2;
  __m256i *pv_1;
  __m256i vCompare;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  parasail_result_t *result;
  __m256i insert_mask;
  int8_t maxp;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vBias;
  int8_t score;
  int8_t bias;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvE;
  __m256i *pvHMax;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined1 in_stack_fffffffffffff5c0 [16];
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff5d8;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  undefined8 in_stack_fffffffffffff5e8;
  __m256i *palVar27;
  longlong in_stack_fffffffffffff5f0;
  __m256i *local_a00;
  long lStack_9e8;
  __m256i local_9c0;
  undefined1 local_9a0 [32];
  longlong local_980;
  longlong lStack_978;
  longlong lStack_970;
  longlong lStack_968;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [32];
  byte local_882;
  __m256i *local_818;
  __m256i *local_810;
  __m256i *local_808;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  byte local_7cc;
  byte local_7c8;
  parasail_result_t *local_7b0;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_590;
  undefined8 uStack_588;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_8","profile");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_8",
            "profile->profile8.score");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_8","profile->matrix");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_8","profile->s1Len"
           );
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_8","s2");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_8","s2Len");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_8","open");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_8","gap");
    local_7b0 = (parasail_result_t *)0x0;
  }
  else {
    local_7e0 = 0;
    local_7dc = *(int *)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 0x10);
    iVar20 = (local_7dc + 0x1f) / 0x20;
    lVar3 = *(long *)(in_RDI + 0x18);
    local_7c8 = (byte)in_ECX;
    auVar4 = vpinsrb_avx(ZEXT116(local_7c8),in_ECX & 0xff,1);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,2);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,3);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,4);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,5);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,6);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,7);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,8);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,9);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,10);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xb);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xc);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xd);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xe);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xf);
    auVar5 = vpinsrb_avx(ZEXT116(local_7c8),in_ECX & 0xff,1);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,2);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,3);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,4);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,5);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,6);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,7);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,8);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,9);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,10);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xb);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xc);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xd);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xe);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xf);
    uStack_6d0 = auVar5._0_8_;
    uStack_6c8 = auVar5._8_8_;
    local_7cc = (byte)in_R8D;
    auVar5 = vpinsrb_avx(ZEXT116(local_7cc),in_R8D & 0xff,1);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,2);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,3);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,4);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,5);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,6);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,7);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,8);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,9);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,10);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xb);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xc);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xd);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xe);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xf);
    auVar22 = vpinsrb_avx(ZEXT116(local_7cc),in_R8D & 0xff,1);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,2);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,3);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,4);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,5);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,6);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,7);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,8);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,9);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,10);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,0xb);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,0xc);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,0xd);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,0xe);
    auVar22 = vpinsrb_avx(auVar22,in_R8D & 0xff,0xf);
    uStack_690 = auVar22._0_8_;
    uStack_688 = auVar22._8_8_;
    uVar25 = 0;
    auVar22 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar22 = vpinsrb_avx(auVar22,0,2);
    auVar22 = vpinsrb_avx(auVar22,0,3);
    auVar22 = vpinsrb_avx(auVar22,0,4);
    auVar22 = vpinsrb_avx(auVar22,0,5);
    auVar22 = vpinsrb_avx(auVar22,0,6);
    auVar22 = vpinsrb_avx(auVar22,0,7);
    auVar22 = vpinsrb_avx(auVar22,0,8);
    auVar22 = vpinsrb_avx(auVar22,0,9);
    auVar22 = vpinsrb_avx(auVar22,0,10);
    auVar22 = vpinsrb_avx(auVar22,0,0xb);
    auVar22 = vpinsrb_avx(auVar22,0,0xc);
    auVar22 = vpinsrb_avx(auVar22,0,0xd);
    auVar22 = vpinsrb_avx(auVar22,0,0xe);
    auVar22 = vpinsrb_avx(auVar22,0,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar6 = vpinsrb_avx(auVar6,0,2);
    auVar6 = vpinsrb_avx(auVar6,0,3);
    auVar6 = vpinsrb_avx(auVar6,0,4);
    auVar6 = vpinsrb_avx(auVar6,0,5);
    auVar6 = vpinsrb_avx(auVar6,0,6);
    auVar6 = vpinsrb_avx(auVar6,0,7);
    auVar6 = vpinsrb_avx(auVar6,0,8);
    auVar6 = vpinsrb_avx(auVar6,0,9);
    auVar6 = vpinsrb_avx(auVar6,0,10);
    auVar6 = vpinsrb_avx(auVar6,0,0xb);
    auVar6 = vpinsrb_avx(auVar6,0,0xc);
    auVar6 = vpinsrb_avx(auVar6,0,0xd);
    auVar6 = vpinsrb_avx(auVar6,0,0xe);
    auVar6 = vpinsrb_avx(auVar6,0,0xf);
    uStack_650 = auVar6._0_8_;
    uStack_648 = auVar6._8_8_;
    local_882 = 0x80;
    uVar26 = 0x80;
    auVar6 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar6 = vpinsrb_avx(auVar6,0x80,2);
    auVar6 = vpinsrb_avx(auVar6,0x80,3);
    auVar6 = vpinsrb_avx(auVar6,0x80,4);
    auVar6 = vpinsrb_avx(auVar6,0x80,5);
    auVar6 = vpinsrb_avx(auVar6,0x80,6);
    auVar6 = vpinsrb_avx(auVar6,0x80,7);
    auVar6 = vpinsrb_avx(auVar6,0x80,8);
    auVar6 = vpinsrb_avx(auVar6,0x80,9);
    auVar6 = vpinsrb_avx(auVar6,0x80,10);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xe);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xf);
    auVar23 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar23 = vpinsrb_avx(auVar23,0x80,2);
    auVar23 = vpinsrb_avx(auVar23,0x80,3);
    auVar23 = vpinsrb_avx(auVar23,0x80,4);
    auVar23 = vpinsrb_avx(auVar23,0x80,5);
    auVar23 = vpinsrb_avx(auVar23,0x80,6);
    auVar23 = vpinsrb_avx(auVar23,0x80,7);
    auVar23 = vpinsrb_avx(auVar23,0x80,8);
    auVar23 = vpinsrb_avx(auVar23,0x80,9);
    auVar23 = vpinsrb_avx(auVar23,0x80,10);
    auVar23 = vpinsrb_avx(auVar23,0x80,0xb);
    auVar23 = vpinsrb_avx(auVar23,0x80,0xc);
    auVar23 = vpinsrb_avx(auVar23,0x80,0xd);
    auVar23 = vpinsrb_avx(auVar23,0x80,0xe);
    auVar23 = vpinsrb_avx(auVar23,0x80,0xf);
    uStack_610 = auVar23._0_8_;
    uStack_608 = auVar23._8_8_;
    local_8e0._16_8_ = uStack_610;
    local_8e0._0_16_ = auVar6;
    local_8e0._24_8_ = uStack_608;
    cVar1 = *(char *)(lVar2 + 0x1c);
    auVar7 = vpinsrb_avx(ZEXT116(1),0,1);
    auVar7 = vpinsrb_avx(auVar7,0,2);
    auVar7 = vpinsrb_avx(auVar7,0,3);
    auVar7 = vpinsrb_avx(auVar7,0,4);
    auVar7 = vpinsrb_avx(auVar7,0,5);
    auVar7 = vpinsrb_avx(auVar7,0,6);
    auVar7 = vpinsrb_avx(auVar7,0,7);
    auVar7 = vpinsrb_avx(auVar7,0,8);
    auVar7 = vpinsrb_avx(auVar7,0,9);
    auVar7 = vpinsrb_avx(auVar7,0,10);
    auVar7 = vpinsrb_avx(auVar7,0,0xb);
    auVar7 = vpinsrb_avx(auVar7,0,0xc);
    auVar7 = vpinsrb_avx(auVar7,0,0xd);
    auVar7 = vpinsrb_avx(auVar7,0,0xe);
    auVar7 = vpinsrb_avx(auVar7,0,0xf);
    auVar8 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar8 = vpinsrb_avx(auVar8,0,2);
    auVar8 = vpinsrb_avx(auVar8,0,3);
    auVar8 = vpinsrb_avx(auVar8,0,4);
    auVar8 = vpinsrb_avx(auVar8,0,5);
    auVar8 = vpinsrb_avx(auVar8,0,6);
    auVar8 = vpinsrb_avx(auVar8,0,7);
    auVar8 = vpinsrb_avx(auVar8,0,8);
    auVar8 = vpinsrb_avx(auVar8,0,9);
    auVar8 = vpinsrb_avx(auVar8,0,10);
    auVar8 = vpinsrb_avx(auVar8,0,0xb);
    auVar8 = vpinsrb_avx(auVar8,0,0xc);
    auVar8 = vpinsrb_avx(auVar8,0,0xd);
    auVar8 = vpinsrb_avx(auVar8,0,0xe);
    auVar8 = vpinsrb_avx(auVar8,0,0xf);
    uStack_590 = auVar8._0_8_;
    uStack_588 = auVar8._8_8_;
    auVar11._16_8_ = uStack_590;
    auVar11._0_16_ = auVar7;
    auVar11._24_8_ = uStack_588;
    auVar9._16_8_ = uStack_650;
    auVar9._0_16_ = auVar22;
    auVar9._24_8_ = uStack_648;
    auVar9 = vpcmpgtb_avx2(auVar11,auVar9);
    auVar24 = ZEXT1664(auVar22);
    local_7b0 = parasail_result_new();
    if (local_7b0 == (parasail_result_t *)0x0) {
      local_7b0 = (parasail_result_t *)0x0;
    }
    else {
      local_7b0->flag = local_7b0->flag | 0x20100804;
      local_808 = parasail_memalign___m256i(0x20,(long)iVar20);
      local_810 = parasail_memalign___m256i(0x20,(long)iVar20);
      local_818 = parasail_memalign___m256i(0x20,(long)iVar20);
      ptr = parasail_memalign___m256i(0x20,(long)iVar20);
      if (local_808 == (__m256i *)0x0) {
        local_7b0 = (parasail_result_t *)0x0;
      }
      else if (local_810 == (__m256i *)0x0) {
        local_7b0 = (parasail_result_t *)0x0;
      }
      else if (local_818 == (__m256i *)0x0) {
        local_7b0 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_7b0 = (parasail_result_t *)0x0;
      }
      else {
        alVar12[0]._4_1_ = local_7c8;
        alVar12[0]._0_4_ = in_stack_fffffffffffff5d8;
        alVar12[0]._5_1_ = local_7cc;
        alVar12[0]._6_1_ = uVar25;
        alVar12[0]._7_1_ = uVar26;
        alVar12[1]._0_4_ = in_stack_fffffffffffff5e0;
        alVar12[1]._4_4_ = in_stack_fffffffffffff5e4;
        alVar12[2] = in_stack_fffffffffffff5e8;
        alVar12[3] = in_stack_fffffffffffff5f0;
        parasail_memset___m256i
                  (local_a00,alVar12,CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
        c[0]._4_1_ = local_7c8;
        c[0]._0_4_ = in_stack_fffffffffffff5d8;
        c[0]._5_1_ = local_7cc;
        c[0]._6_1_ = uVar25;
        c[0]._7_1_ = uVar26;
        c[1]._0_4_ = in_stack_fffffffffffff5e0;
        c[1]._4_4_ = in_stack_fffffffffffff5e4;
        c[2] = in_stack_fffffffffffff5e8;
        c[3] = in_stack_fffffffffffff5f0;
        parasail_memset___m256i
                  (local_a00,c,CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
        local_7d4 = 0;
        auVar22 = auVar6;
        while( true ) {
          palVar19 = local_808;
          palVar27 = local_818;
          uStack_8e8 = auVar23._8_8_;
          uStack_8f0 = auVar23._0_8_;
          if (in_EDX <= local_7d4) break;
          local_9a0._16_8_ = uStack_610;
          local_9a0._0_16_ = auVar6;
          local_9a0._24_8_ = uStack_608;
          auVar11 = vperm2i128_avx2(auVar24._0_32_,(undefined1  [32])local_808[iVar20 + -1],0x28);
          auVar11 = vpalignr_avx2((undefined1  [32])local_808[iVar20 + -1],auVar11,0xf);
          auVar10._16_8_ = uStack_610;
          auVar10._0_16_ = auVar6;
          auVar10._24_8_ = uStack_608;
          local_9c0 = (__m256i)vpblendvb_avx2(auVar11,auVar10,auVar9);
          iVar21 = *(int *)(*(long *)(lVar2 + 0x10) + (ulong)*(byte *)(in_RSI + local_7d4) * 4);
          if (local_7e0 == local_7d4 + -2) {
            local_818 = local_810;
            local_808 = palVar27;
          }
          else {
            local_808 = local_810;
          }
          local_810 = palVar19;
          for (local_7d0 = 0; local_7d0 < iVar20; local_7d0 = local_7d0 + 1) {
            auVar11 = vpaddsb_avx2((undefined1  [32])local_9c0,
                                   *(undefined1 (*) [32])
                                    (lVar3 + (long)(iVar21 * iVar20) * 0x20 + (long)local_7d0 * 0x20
                                    ));
            alVar12 = ptr[local_7d0];
            auVar11 = vpmaxsb_avx2(auVar11,(undefined1  [32])ptr[local_7d0]);
            auVar11 = vpmaxsb_avx2(auVar11,local_9a0);
            palVar27 = local_808 + local_7d0;
            local_9c0[0] = auVar11._0_8_;
            local_9c0[1] = auVar11._8_8_;
            local_9c0[2] = auVar11._16_8_;
            local_9c0[3] = auVar11._24_8_;
            (*palVar27)[0] = local_9c0[0];
            (*palVar27)[1] = local_9c0[1];
            (*palVar27)[2] = local_9c0[2];
            (*palVar27)[3] = local_9c0[3];
            local_8e0 = vpmaxsb_avx2(auVar11,local_8e0);
            auVar18._16_8_ = uStack_6d0;
            auVar18._0_16_ = auVar4;
            auVar18._24_8_ = uStack_6c8;
            auVar10 = vpsubsb_avx2(auVar11,auVar18);
            auVar17._16_8_ = uStack_690;
            auVar17._0_16_ = auVar5;
            auVar17._24_8_ = uStack_688;
            auVar11 = vpsubsb_avx2((undefined1  [32])alVar12,auVar17);
            auVar11 = vpmaxsb_avx2(auVar11,auVar10);
            palVar27 = ptr + local_7d0;
            local_980 = auVar11._0_8_;
            lStack_978 = auVar11._8_8_;
            lStack_970 = auVar11._16_8_;
            lStack_968 = auVar11._24_8_;
            (*palVar27)[0] = local_980;
            (*palVar27)[1] = lStack_978;
            (*palVar27)[2] = lStack_970;
            (*palVar27)[3] = lStack_968;
            auVar16._16_8_ = uStack_690;
            auVar16._0_16_ = auVar5;
            auVar16._24_8_ = uStack_688;
            auVar11 = vpsubsb_avx2(local_9a0,auVar16);
            local_9a0 = vpmaxsb_avx2(auVar11,auVar10);
            local_9c0 = palVar19[local_7d0];
          }
          for (local_7d8 = 0; local_7d8 < 0x20; local_7d8 = local_7d8 + 1) {
            auVar11 = vperm2i128_avx2(auVar10,local_9a0,0x28);
            auVar11 = vpalignr_avx2(local_9a0,auVar11,0xf);
            local_9a0 = vpblendvb_avx2(auVar11,auVar10,auVar9);
            for (local_7d0 = 0; local_7d0 < iVar20; local_7d0 = local_7d0 + 1) {
              auVar11 = vpmaxsb_avx2((undefined1  [32])local_808[local_7d0],local_9a0);
              palVar27 = local_808 + local_7d0;
              local_9c0[0] = auVar11._0_8_;
              local_9c0[1] = auVar11._8_8_;
              local_9c0[2] = auVar11._16_8_;
              local_9c0[3] = auVar11._24_8_;
              (*palVar27)[0] = local_9c0[0];
              (*palVar27)[1] = local_9c0[1];
              (*palVar27)[2] = local_9c0[2];
              (*palVar27)[3] = local_9c0[3];
              local_8e0 = vpmaxsb_avx2(auVar11,local_8e0);
              auVar15._16_8_ = uStack_6d0;
              auVar15._0_16_ = auVar4;
              auVar15._24_8_ = uStack_6c8;
              auVar10 = vpsubsb_avx2(auVar11,auVar15);
              auVar14._16_8_ = uStack_690;
              auVar14._0_16_ = auVar5;
              auVar14._24_8_ = uStack_688;
              local_9a0 = vpsubsb_avx2(local_9a0,auVar14);
              auVar11 = vpcmpgtb_avx2(local_9a0,auVar10);
              if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar11 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar11 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar11 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar11 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar11 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar11 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar11 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar11 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar11 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar11 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar11 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar11 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar11 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar11 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar11 >> 0x7f,0) == '\0') &&
                                (auVar11 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar11 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar11 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar11 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar11 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar11 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar11 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar11 >> 0xbf,0) == '\0') &&
                        (auVar11 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar11 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar11 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar11 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar11 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar11 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar11[0x1f]) goto LAB_00bd5677;
            }
          }
LAB_00bd5677:
          auVar13._16_8_ = uStack_8f0;
          auVar13._0_16_ = auVar22;
          auVar13._24_8_ = uStack_8e8;
          auVar24 = ZEXT3264(auVar13);
          auVar11 = vpcmpgtb_avx2(local_8e0,auVar13);
          lStack_9e8 = auVar11._24_8_;
          if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                            (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar11 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0xbf,0) != '\0') ||
                    (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_9e8 < 0)
          {
            a[1] = in_stack_fffffffffffff5c0._0_8_;
            a[2] = in_stack_fffffffffffff5c0._8_8_;
            a[0] = 0xbd56ea;
            a[3]._0_4_ = in_stack_fffffffffffff5d0;
            a[3]._4_4_ = in_stack_fffffffffffff5d4;
            local_882 = _mm256_hmax_epi8_rpl(a);
            if ((char)(cVar1 + 1U ^ 0x7f) < (char)local_882) {
              local_7b0->flag = local_7b0->flag | 0x40;
              break;
            }
            auVar22 = vpinsrb_avx(ZEXT116(local_882),(uint)local_882,1);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,2);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,3);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,4);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,5);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,6);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,7);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,8);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,9);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,10);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xb);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xc);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xd);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xe);
            auVar23 = vpinsrb_avx(auVar22,(uint)local_882,0xf);
            auVar24 = ZEXT1664(auVar23);
            auVar22 = vpinsrb_avx(ZEXT116(local_882),(uint)local_882,1);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,2);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,3);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,4);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,5);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,6);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,7);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,8);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,9);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,10);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xb);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xc);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xd);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xe);
            auVar22 = vpinsrb_avx(auVar22,(uint)local_882,0xf);
            auVar22 = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar22;
            auVar23 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
            local_7e0 = local_7d4;
          }
          local_7d4 = local_7d4 + 1;
        }
        palVar27 = local_818;
        if (local_882 == 0x7f) {
          local_7b0->flag = local_7b0->flag | 0x40;
        }
        iVar21 = parasail_result_is_saturated(local_7b0);
        if (iVar21 == 0) {
          if (local_7e0 == local_7d4 + -1) {
            local_818 = local_808;
            local_808 = palVar27;
          }
          else if (local_7e0 == local_7d4 + -2) {
            local_818 = local_810;
            local_810 = palVar27;
          }
          local_7dc = local_7dc + -1;
          palVar27 = local_818;
          for (local_7d0 = 0; local_7d0 < iVar20 * 0x20; local_7d0 = local_7d0 + 1) {
            if (((byte)(*palVar27)[0] == local_882) &&
               (iVar21 = local_7d0 / 0x20 + (local_7d0 % 0x20) * iVar20, iVar21 < local_7dc)) {
              local_7dc = iVar21;
            }
            palVar27 = (__m256i *)((long)*palVar27 + 1);
          }
        }
        else {
          local_882 = 0x7f;
          local_7dc = 0;
          local_7e0 = 0;
        }
        local_7b0->score = (char)local_882 + 0x80;
        local_7b0->end_query = local_7dc;
        local_7b0->end_ref = local_7e0;
        parasail_free(ptr);
        parasail_free(local_818);
        parasail_free(local_810);
        parasail_free(local_808);
      }
    }
  }
  return local_7b0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}